

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::erase(DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *this,iterator I)

{
  pointer puVar1;
  pointer pvVar2;
  
  pvVar2 = I.Ptr;
  puVar1 = (pvVar2->
           super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
           second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(pvVar2->
                                 super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 ).second.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  (pvVar2->super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
  first = 0xfffffffffffffffe;
  *(ulong *)(this + 8) =
       CONCAT44((int)((ulong)*(undefined8 *)(this + 8) >> 0x20) + 1,
                (int)*(undefined8 *)(this + 8) + -1);
  return;
}

Assistant:

void erase(iterator I) {
    BucketT *TheBucket = &*I;
    TheBucket->getSecond().~ValueT();
    TheBucket->getFirst() = getTombstoneKey();
    decrementNumEntries();
    incrementNumTombstones();
  }